

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPage::setPixmap(QWizardPage *this,WizardPixmap which,QPixmap *pixmap)

{
  QWizardPagePrivate *this_00;
  QWizardPage *pQVar1;
  QPixmap *in_RDX;
  uint in_ESI;
  QWizardPage *in_RDI;
  QWizardPagePrivate *d;
  WizardPixmap which_00;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = d_func((QWizardPage *)0x7bcd14);
  QPixmap::operator=((QPixmap *)(&this_00->field_0x290 + (ulong)in_ESI * 0x18),in_RDX);
  which_00 = (WizardPixmap)((ulong)in_RDX >> 0x20);
  if (this_00->wizard != (QWizard *)0x0) {
    pQVar1 = QWizard::currentPage((QWizard *)this_00);
    if (pQVar1 == in_RDI) {
      QWizard::d_func((QWizard *)0x7bcd74);
      QWizardPrivate::updatePixmap
                ((QWizardPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),which_00);
    }
  }
  return;
}

Assistant:

void QWizardPage::setPixmap(QWizard::WizardPixmap which, const QPixmap &pixmap)
{
    Q_D(QWizardPage);
    Q_ASSERT(uint(which) < QWizard::NPixmaps);
    d->pixmaps[which] = pixmap;
    if (d->wizard && d->wizard->currentPage() == this)
        d->wizard->d_func()->updatePixmap(which);
}